

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void Service_CreateMonitoredItems
               (UA_Server *server,UA_Session *session,UA_CreateMonitoredItemsRequest *request,
               UA_CreateMonitoredItemsResponse *response)

{
  UA_TimestampsToReturn timestamps;
  UA_MonitoredItemCreateRequest *pUVar1;
  UA_MonitoredItem *pUVar2;
  UA_Subscription *pUVar3;
  UA_Boolean UVar4;
  UA_StatusCode UVar5;
  UA_UInt32 UVar6;
  UA_MonitoredItemCreateResult *pUVar7;
  UA_Session *mon;
  size_t size;
  UA_Session *session_00;
  UA_ReadValueId *id;
  long lVar8;
  long lVar9;
  UA_DataValue local_d8;
  UA_CreateMonitoredItemsResponse *local_78;
  UA_Subscription *local_70;
  UA_ListOfUAMonitoredItems *local_68;
  UA_UInt32 *local_60;
  UA_Server *local_58;
  UA_MonitoredItemCreateResult *local_50;
  ulong local_48;
  long local_40;
  UA_CreateMonitoredItemsRequest *local_38;
  
  UVar5 = 0x802b0000;
  if (request->timestampsToReturn < 4) {
    local_58 = server;
    local_70 = UA_Session_getSubscriptionByID(session,request->subscriptionId);
    if (local_70 == (UA_Subscription *)0x0) {
      UVar5 = 0x80280000;
    }
    else {
      local_70->currentLifetimeCount = 0;
      size = request->itemsToCreateSize;
      if (size == 0) {
        UVar5 = 0x800f0000;
      }
      else {
        session_00 = (UA_Session *)(UA_TYPES + 0x34);
        pUVar7 = (UA_MonitoredItemCreateResult *)UA_Array_new(size,UA_TYPES + 0x34);
        response->results = pUVar7;
        if (pUVar7 != (UA_MonitoredItemCreateResult *)0x0) {
          response->resultsSize = size;
          local_68 = &local_70->monitoredItems;
          lVar9 = 0x38;
          local_40 = 0;
          local_48 = 0;
          local_78 = response;
          local_38 = request;
          do {
            if (size <= local_48) {
              return;
            }
            timestamps = request->timestampsToReturn;
            pUVar1 = request->itemsToCreate;
            id = (UA_ReadValueId *)((long)pUVar1 + lVar9 + -0x38);
            pUVar7 = local_78->results;
            local_d8.serverTimestamp = 0;
            local_d8.serverPicoseconds = 0;
            local_d8._90_6_ = 0;
            local_d8.sourceTimestamp = 0;
            local_d8.sourcePicoseconds = 0;
            local_d8._74_6_ = 0;
            local_d8.value.arrayDimensions = (UA_UInt32 *)0x0;
            local_d8.status = 0;
            local_d8._60_4_ = 0;
            local_d8.value.data = (void *)0x0;
            local_d8.value.arrayDimensionsSize = 0;
            local_d8.value.storageType = UA_VARIANT_DATA;
            local_d8.value._12_4_ = 0;
            local_d8.value.arrayLength = 0;
            local_d8._0_8_ = 0;
            local_d8.value.type = (UA_DataType *)0x0;
            Service_Read_single(local_58,session_00,timestamps,id,&local_d8);
            lVar8 = local_40;
            if (((((local_d8._0_8_ & 2) == 0) || (-1 < (int)local_d8.status)) ||
                (local_d8.status == 0x80040000)) ||
               ((local_d8.status == 0x80050000 || (local_d8.status == 0x80320000)))) {
              UA_DataValue_deleteMembers(&local_d8);
              if (*(long *)((long)&(pUVar1->itemToMonitor).nodeId.namespaceIndex + lVar9) == 0) {
                local_60 = (UA_UInt32 *)((long)pUVar1 + lVar9 + -0x20);
LAB_00121bf2:
                local_50 = pUVar7;
                mon = (UA_Session *)UA_MonitoredItem_new();
                if (mon == (UA_Session *)0x0) {
                  *(undefined4 *)((long)&local_50->statusCode + local_40) = 0x80030000;
                  request = local_38;
                  lVar8 = local_40;
                }
                else {
                  UVar5 = UA_NodeId_copy((UA_NodeId *)id,
                                         (UA_NodeId *)
                                         &(mon->clientDescription).applicationName.locale.data);
                  lVar8 = local_40;
                  pUVar3 = local_70;
                  if (UVar5 == 0) {
                    (mon->clientDescription).productUri.length = (size_t)local_70;
                    (mon->clientDescription).applicationType = *local_60;
                    UVar6 = local_70->lastMonitoredItemId + 1;
                    local_70->lastMonitoredItemId = UVar6;
                    *(UA_UInt32 *)&(mon->clientDescription).productUri.data = UVar6;
                    *(UA_TimestampsToReturn *)
                     &(mon->clientDescription).applicationName.locale.length = timestamps;
                    setMonitoredItemSettings
                              (local_58,(UA_MonitoredItem *)mon,
                               *(UA_MonitoringMode *)
                                ((long)&(pUVar1->itemToMonitor).nodeId.identifier + lVar9 + 8),
                               (UA_MonitoringParameters *)
                               ((long)&(pUVar1->itemToMonitor).attributeId + lVar9));
                    request = local_38;
                    pUVar2 = (pUVar3->monitoredItems).lh_first;
                    (mon->clientDescription).applicationUri.length = (size_t)pUVar2;
                    if (pUVar2 != (UA_MonitoredItem *)0x0) {
                      (pUVar2->listEntry).le_prev = (UA_MonitoredItem **)mon;
                    }
                    local_68->lh_first = (UA_MonitoredItem *)mon;
                    (mon->clientDescription).applicationUri.data = (UA_Byte *)local_68;
                    if (*(int *)((long)&(pUVar1->itemToMonitor).nodeId.identifier + lVar9 + 8) == 2)
                    {
                      UA_MoniteredItem_SampleCallback(local_58,(UA_MonitoredItem *)mon);
                    }
                    session_00 = (UA_Session *)&(mon->clientDescription).discoveryProfileUri.data;
                    UA_String_copy((UA_String *)((long)pUVar1 + lVar9 + -0x18),
                                   (UA_String *)session_00);
                    *(size_t *)((long)&local_50->revisedSamplingInterval + local_40) =
                         (mon->clientDescription).gatewayServerUri.length;
                    *(UA_UInt32 *)((long)&local_50->revisedQueueSize + local_40) =
                         *(UA_UInt32 *)((long)&(mon->clientDescription).gatewayServerUri.data + 4);
                    *(UA_UInt32 *)((long)&local_50->monitoredItemId + local_40) =
                         *(UA_UInt32 *)&(mon->clientDescription).productUri.data;
                    lVar8 = local_40;
                  }
                  else {
                    *(UA_StatusCode *)((long)&local_50->statusCode + local_40) = UVar5;
                    MonitoredItem_delete(local_58,(UA_MonitoredItem *)mon);
                    session_00 = mon;
                    request = local_38;
                  }
                }
              }
              else {
                session_00 = (UA_Session *)
                             ((long)&(pUVar1->itemToMonitor).nodeId.namespaceIndex + lVar9);
                UVar4 = UA_String_equal(&binaryEncoding,(UA_String *)session_00);
                lVar8 = local_40;
                request = local_38;
                if ((UVar4) && (*(short *)((long)pUVar1 + lVar9 + -8) == 0)) {
                  if (*(int *)((long)pUVar1 + lVar9 + -0x20) == 0xd) {
                    local_60 = &pUVar1[local_48].itemToMonitor.attributeId;
                    goto LAB_00121bf2;
                  }
                  *(undefined4 *)((long)&pUVar7->statusCode + local_40) = 0x80380000;
                }
                else {
                  *(undefined4 *)((long)&pUVar7->statusCode + local_40) = 0x80390000;
                }
              }
            }
            else {
              *(UA_StatusCode *)((long)&pUVar7->statusCode + local_40) = local_d8.status;
              UA_DataValue_deleteMembers(&local_d8);
              request = local_38;
            }
            local_48 = local_48 + 1;
            size = request->itemsToCreateSize;
            lVar9 = lVar9 + 0x98;
            local_40 = lVar8 + 0x48;
          } while( true );
        }
        UVar5 = 0x80030000;
      }
    }
  }
  (response->responseHeader).serviceResult = UVar5;
  return;
}

Assistant:

void
Service_CreateMonitoredItems(UA_Server *server, UA_Session *session,
                             const UA_CreateMonitoredItemsRequest *request,
                             UA_CreateMonitoredItemsResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Processing CreateMonitoredItemsRequest");

    /* Check if the timestampstoreturn is valid */
    if(request->timestampsToReturn > UA_TIMESTAMPSTORETURN_NEITHER) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADTIMESTAMPSTORETURNINVALID;
        return;
    }

    UA_Subscription *sub = UA_Session_getSubscriptionByID(session, request->subscriptionId);
    if(!sub) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;
        return;
    }

    /* Reset the subscription lifetime */
    sub->currentLifetimeCount = 0;
    if(request->itemsToCreateSize <= 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    response->results = UA_Array_new(request->itemsToCreateSize,
                                     &UA_TYPES[UA_TYPES_MONITOREDITEMCREATERESULT]);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->resultsSize = request->itemsToCreateSize;

    for(size_t i = 0; i < request->itemsToCreateSize; ++i)
        Service_CreateMonitoredItems_single(server, session, sub, request->timestampsToReturn,
                                            &request->itemsToCreate[i], &response->results[i]);
}